

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O0

void __thiscall pg::PPSolver::setDominion(PPSolver *this,int p)

{
  int vertex;
  vector<int,_std::allocator<int>_> *pvVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  reference piVar5;
  uint winner;
  int local_50;
  iterator iStack_30;
  int i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int pl;
  int p_local;
  PPSolver *this_local;
  
  winner = p & 1;
  if ((this->super_Solver).trace != 0) {
    poVar4 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;201mdominion \x1b[36m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,p);
    std::operator<<(poVar4,"\x1b[m");
  }
  pvVar1 = this->regions;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(pvVar1 + p);
  iStack_30 = std::vector<int,_std::allocator<int>_>::end(pvVar1 + p);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar2) {
      if ((this->super_Solver).trace != 0) {
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
      Solver::flush(&this->super_Solver);
      return;
    }
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    vertex = *piVar5;
    if (this->region[vertex] != p) break;
    uVar3 = Solver::owner(&this->super_Solver,vertex);
    bVar2 = true;
    if ((uVar3 == winner) && (bVar2 = false, this->strategy[vertex] != -1)) {
      bVar2 = this->region[this->strategy[vertex]] == p;
    }
    if (!bVar2) {
      __assert_fail("owner(i) != pl or (strategy[i] != -1 and region[strategy[i]] == p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                    ,0xdb,"void pg::PPSolver::setDominion(int)");
    }
    if (1 < (this->super_Solver).trace) {
      poVar4 = std::operator<<((this->super_Solver).logger," ");
      std::ostream::operator<<(poVar4,vertex);
    }
    uVar3 = Solver::owner(&this->super_Solver,vertex);
    if (uVar3 == winner) {
      local_50 = this->strategy[vertex];
    }
    else {
      local_50 = -1;
    }
    Solver::solve(&this->super_Solver,vertex,winner,local_50);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  __assert_fail("region[i] == p",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                ,0xda,"void pg::PPSolver::setDominion(int)");
}

Assistant:

void
PPSolver::setDominion(int p)
{
    // found a dominion
    const int pl = p&1;
    if (trace) logger << "\033[1;38;5;201mdominion \033[36m" << p << "\033[m";
    for (int i : regions[p]) {
        assert(region[i] == p);
        assert(owner(i) != pl or (strategy[i] != -1 and region[strategy[i]] == p));
#ifndef NDEBUG
        if (trace >= 2) logger << " " << i;
#endif
        Solver::solve(i, pl, owner(i) == pl ? strategy[i] : -1);
    }
    if (trace) logger << std::endl;
    Solver::flush();
}